

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec16.c
# Opt level: O0

If_Grp_t *
If_CluFindGroup(If_Grp_t *__return_storage_ptr__,word *pF,int nVars,int iVarStart,int iVarStop,
               int *V2P,int *P2V,int nBSsize,int fDisjoint)

{
  int iVar1;
  int local_50;
  int local_4c;
  int nCofsBest2;
  int VarBest;
  int nCofs;
  int v;
  int r;
  int i;
  If_Grp_t *g;
  int nRounds;
  int fVerbose;
  int *V2P_local;
  int iVarStop_local;
  int iVarStart_local;
  int nVars_local;
  word *pF_local;
  
  memset(__return_storage_ptr__,0,0x12);
  if (((nVars <= nBSsize) || (nVars < nBSsize + iVarStart)) || (0x10 < nVars)) {
    __assert_fail("nVars > nBSsize && nVars >= nBSsize + iVarStart && nVars <= CLU_VAR_MAX",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDec16.c"
                  ,0x520,"If_Grp_t If_CluFindGroup(word *, int, int, int, int *, int *, int, int)");
  }
  if ((nBSsize < 2) || (6 < nBSsize)) {
    __assert_fail("nBSsize >= 2 && nBSsize <= 6",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDec16.c"
                  ,0x521,"If_Grp_t If_CluFindGroup(word *, int, int, int, int *, int *, int, int)");
  }
  if ((iVarStart != 0) && (iVarStop != 0)) {
    __assert_fail("!iVarStart || !iVarStop",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDec16.c"
                  ,0x522,"If_Grp_t If_CluFindGroup(word *, int, int, int, int *, int *, int, int)");
  }
  __return_storage_ptr__->nVars = (char)nBSsize;
  iVar1 = If_CluCountCofs(pF,nVars,nBSsize,0,(word (*) [256])0x0);
  __return_storage_ptr__->nMyu = (char)iVar1;
  for (v = 0; v < nBSsize; v = v + 1) {
    __return_storage_ptr__->pVars[v] = (char)P2V[(nVars - nBSsize) + v];
  }
  if ((__return_storage_ptr__->nMyu != '\x02') &&
     ((fDisjoint != 0 ||
      (iVar1 = If_CluCheckNonDisjointGroup(pF,nVars,V2P,P2V,__return_storage_ptr__), iVar1 == 0))))
  {
    if (nVars == nBSsize + iVarStart) {
      __return_storage_ptr__->nVars = '\0';
    }
    else {
      for (nCofs = 0; nCofs < 2; nCofs = nCofs + 1) {
        if (nBSsize < nVars + -1) {
          local_4c = P2V[(nVars + -1) - nBSsize];
          local_50 = If_CluCountCofs(pF,nVars,nBSsize + 1,0,(word (*) [256])0x0);
          for (VarBest = (nVars + -2) - nBSsize; iVarStart <= VarBest; VarBest = VarBest + -1) {
            If_CluMoveVar2(pF,nVars,V2P,P2V,P2V[VarBest],(nVars + -1) - nBSsize);
            iVar1 = If_CluCountCofs(pF,nVars,nBSsize + 1,0,(word (*) [256])0x0);
            if (iVar1 <= local_50) {
              local_4c = P2V[(nVars + -1) - nBSsize];
              local_50 = iVar1;
            }
          }
          If_CluMoveVar2(pF,nVars,V2P,P2V,local_4c,(nVars + -1) - nBSsize);
          iVar1 = If_CluCountCofs(pF,nVars,nBSsize + 1,0,(word (*) [256])0x0);
          if (iVar1 != local_50) {
            __assert_fail("nCofs == nCofsBest2",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDec16.c"
                          ,0x554,
                          "If_Grp_t If_CluFindGroup(word *, int, int, int, int *, int *, int, int)")
            ;
          }
        }
        local_4c = P2V[(nVars + -1) - nBSsize];
        local_50 = If_CluCountCofs(pF,nVars,nBSsize,0,(word (*) [256])0x0);
        for (VarBest = nVars - nBSsize; VarBest < nVars - iVarStop; VarBest = VarBest + 1) {
          If_CluMoveVar2(pF,nVars,V2P,P2V,P2V[VarBest],(nVars + -1) - nBSsize);
          iVar1 = If_CluCountCofs(pF,nVars,nBSsize,0,(word (*) [256])0x0);
          if (iVar1 <= local_50) {
            local_4c = P2V[(nVars + -1) - nBSsize];
            local_50 = iVar1;
          }
        }
        If_CluMoveVar2(pF,nVars,V2P,P2V,local_4c,(nVars + -1) - nBSsize);
        iVar1 = If_CluCountCofs(pF,nVars,nBSsize,0,(word (*) [256])0x0);
        if (iVar1 != local_50) {
          __assert_fail("nCofs == nCofsBest2",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDec16.c"
                        ,0x56b,
                        "If_Grp_t If_CluFindGroup(word *, int, int, int, int *, int *, int, int)");
        }
        if (iVar1 <= __return_storage_ptr__->nMyu) {
          __return_storage_ptr__->nVars = (char)nBSsize;
          __return_storage_ptr__->nMyu = (char)iVar1;
          for (v = 0; v < nBSsize; v = v + 1) {
            __return_storage_ptr__->pVars[v] = (char)P2V[(nVars - nBSsize) + v];
          }
        }
        if (__return_storage_ptr__->nMyu == '\x02') {
          return __return_storage_ptr__;
        }
        if ((fDisjoint == 0) &&
           (iVar1 = If_CluCheckNonDisjointGroup(pF,nVars,V2P,P2V,__return_storage_ptr__), iVar1 != 0
           )) {
          return __return_storage_ptr__;
        }
      }
      if (nCofs != 2) {
        __assert_fail("r == nRounds",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDec16.c"
                      ,0x584,
                      "If_Grp_t If_CluFindGroup(word *, int, int, int, int *, int *, int, int)");
      }
      __return_storage_ptr__->nVars = '\0';
    }
  }
  return __return_storage_ptr__;
}

Assistant:

If_Grp_t If_CluFindGroup( word * pF, int nVars, int iVarStart, int iVarStop, int * V2P, int * P2V, int nBSsize, int fDisjoint )
{
    int fVerbose = 0;
    int nRounds = 2;//nBSsize;
    If_Grp_t G = {0}, * g = &G;//, BestG = {0};
    int i, r, v, nCofs, VarBest, nCofsBest2;
    assert( nVars > nBSsize && nVars >= nBSsize + iVarStart && nVars <= CLU_VAR_MAX );
    assert( nBSsize >= 2 && nBSsize <= 6 );
    assert( !iVarStart || !iVarStop );
    // start with the default group
    g->nVars = nBSsize;
    g->nMyu = If_CluCountCofs( pF, nVars, nBSsize, 0, NULL );
    for ( i = 0; i < nBSsize; i++ )
        g->pVars[i] = P2V[nVars-nBSsize+i];
    // check if good enough
    if ( g->nMyu == 2 )
        return G;
    if ( !fDisjoint && If_CluCheckNonDisjointGroup( pF, nVars, V2P, P2V, g ) )
    {
//        BestG = G;
        return G;
    }
    if ( nVars == nBSsize + iVarStart )
    {
        g->nVars = 0;
        return G;
    }

    if ( fVerbose )
    {
        printf( "Iter %2d  ", -1 );
        If_CluPrintGroup( g );
    }

    // try to find better group
    for ( r = 0; r < nRounds; r++ )
    {
        if ( nBSsize < nVars-1 )
        {
            // find the best var to add
            VarBest = P2V[nVars-1-nBSsize];
            nCofsBest2 = If_CluCountCofs( pF, nVars, nBSsize+1, 0, NULL );
            for ( v = nVars-2-nBSsize; v >= iVarStart; v-- )
            {
//                If_CluMoveVar( pF, nVars, V2P, P2V, P2V[v], nVars-1-nBSsize );
                If_CluMoveVar2( pF, nVars, V2P, P2V, P2V[v], nVars-1-nBSsize );
                nCofs = If_CluCountCofs( pF, nVars, nBSsize+1, 0, NULL );
                if ( nCofsBest2 >= nCofs )
                {
                    nCofsBest2 = nCofs;
                    VarBest = P2V[nVars-1-nBSsize];
                }
            }
            // go back
//            If_CluMoveVar( pF, nVars, V2P, P2V, VarBest, nVars-1-nBSsize );
            If_CluMoveVar2( pF, nVars, V2P, P2V, VarBest, nVars-1-nBSsize );
            // update best bound set
            nCofs = If_CluCountCofs( pF, nVars, nBSsize+1, 0, NULL );
            assert( nCofs == nCofsBest2 );
        }

        // find the best var to remove
        VarBest = P2V[nVars-1-nBSsize];
        nCofsBest2 = If_CluCountCofs( pF, nVars, nBSsize, 0, NULL );
        for ( v = nVars-nBSsize; v < nVars-iVarStop; v++ )
        {
//            If_CluMoveVar( pF, nVars, V2P, P2V, P2V[v], nVars-1-nBSsize );
            If_CluMoveVar2( pF, nVars, V2P, P2V, P2V[v], nVars-1-nBSsize );
            nCofs = If_CluCountCofs( pF, nVars, nBSsize, 0, NULL );
            if ( nCofsBest2 >= nCofs )
            {
                nCofsBest2 = nCofs;
                VarBest = P2V[nVars-1-nBSsize];
            }
        }

        // go back
//        If_CluMoveVar( pF, nVars, V2P, P2V, VarBest, nVars-1-nBSsize );
        If_CluMoveVar2( pF, nVars, V2P, P2V, VarBest, nVars-1-nBSsize );
        // update best bound set
        nCofs = If_CluCountCofs( pF, nVars, nBSsize, 0, NULL );
        assert( nCofs == nCofsBest2 );
        if ( g->nMyu >= nCofs )
        {
            g->nVars = nBSsize;
            g->nMyu = nCofs;
            for ( i = 0; i < nBSsize; i++ )
                g->pVars[i] = P2V[nVars-nBSsize+i];
        }

        if ( fVerbose )
        {
            printf( "Iter %2d  ", r );
            If_CluPrintGroup( g );
        }

        // check if good enough
        if ( g->nMyu == 2 )
            return G;
        if ( !fDisjoint && If_CluCheckNonDisjointGroup( pF, nVars, V2P, P2V, g ) )
        {
//            BestG = G;
            return G;
        }
    }

    assert( r == nRounds );
    g->nVars = 0;
    return G;
//    return BestG;
}